

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O2

void __thiscall helics::FederateState::processDataMessage(FederateState *this,ActionMessage *cmd)

{
  ushort uVar1;
  long lVar2;
  TimeCoordinator *pTVar3;
  GlobalHandle source_id;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  EndpointInfo *pEVar7;
  InputInfo *this_00;
  string *psVar8;
  ActionMessage *command;
  ActionMessage *extraout_RDX;
  ActionMessage *command_00;
  ActionMessage *extraout_RDX_00;
  ActionMessage *extraout_RDX_01;
  ActionMessage *extraout_RDX_02;
  ActionMessage *extraout_RDX_03;
  ActionMessage *pAVar9;
  Time TVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  GlobalHandle *pGVar11;
  string_view fmt;
  string_view logMessageSource;
  string_view fmt_00;
  string_view logMessageSource_00;
  string_view query;
  string_view logMessageSource_01;
  string_view fmt_01;
  string_view logMessageSource_02;
  string_view fmt_02;
  string_view logMessageSource_03;
  string_view logMessageSource_04;
  string_view fmt_03;
  string_view logMessageSource_05;
  format_args args;
  string_view message;
  format_args args_00;
  string_view message_00;
  string_view message_01;
  format_args args_01;
  string_view message_02;
  format_args args_02;
  string_view message_03;
  string_view message_04;
  format_args args_03;
  string_view message_05;
  string local_d8;
  string qres;
  string local_78;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_50;
  helics local_48 [8];
  undefined1 local_40 [16];
  
  if (cmd->messageAction == cmd_pub) {
    this_00 = InterfaceInfo::getInput
                        (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (this_00 != (InputInfo *)0x0) {
      pGVar11 = (this_00->input_sources).
                super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (pGVar11 ==
            (this_00->input_sources).
            super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_002aa842:
          if (EXECUTING < (this->state)._M_i) {
            return;
          }
          pTVar3 = (this->timeCoord)._M_t.
                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
          (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                    (pTVar3,cmd);
          return;
        }
        if (((cmd->source_id).gid == (pGVar11->fed_id).gid) &&
           ((cmd->source_handle).hid == (pGVar11->handle).hid)) {
          lVar2 = (cmd->actionTime).internalTimeCode;
          TVar10.internalTimeCode = (this->time_granted).internalTimeCode;
          if (TVar10.internalTimeCode < lVar2) {
            TVar10.internalTimeCode = lVar2;
          }
          if (this->timeMethod != ASYNC) {
            TVar10.internalTimeCode = lVar2;
          }
          source_id = *pGVar11;
          uVar1 = cmd->counter;
          std::make_shared<helics::SmallBuffer_const,helics::SmallBuffer>((SmallBuffer *)local_40);
          bVar6 = InputInfo::addData(this_00,source_id,TVar10,(uint)uVar1,
                                     (shared_ptr<const_helics::SmallBuffer> *)local_40);
          CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
          if (bVar6) {
            pAVar9 = extraout_RDX_01;
            if ((this_00->not_interruptible == false) &&
               (TimeCoordinator::updateValueTime
                          ((this->timeCoord)._M_t.
                           super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                           .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
                           TVar10,(bool)(this->timeGranted_mode ^ 1)),
               sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length,
               _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus, pAVar9 = extraout_RDX_02,
               0x17 < this->maxLogLevel)) {
              (**(code **)((long)(((this->timeCoord)._M_t.
                                   super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
                                   .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>.
                                  _M_head_impl)->super_BaseTimeCoordinator).
                                 _vptr_BaseTimeCoordinator + 0x58))(&qres);
              logMessageSource_04._M_str = _Var4._M_p;
              logMessageSource_04._M_len = sVar5;
              message_04._M_str = qres._M_dataplus._M_p;
              message_04._M_len = qres._M_string_length;
              in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                      qres._M_dataplus;
              logMessage(this,0x18,logMessageSource_04,message_04,false);
              std::__cxx11::string::~string((string *)&qres);
              pAVar9 = extraout_RDX_03;
            }
            sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
            _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
            if (0x11 < this->maxLogLevel) {
              prettyPrintString_abi_cxx11_(&local_78,(helics *)cmd,pAVar9);
              psVar8 = InputInfo::getSourceName_abi_cxx11_(this_00,*pGVar11);
              qres._M_dataplus._M_p = local_78._M_dataplus._M_p;
              qres._M_string_length = local_78._M_string_length;
              qres.field_2._M_allocated_capacity = (size_type)(psVar8->_M_dataplus)._M_p;
              qres.field_2._8_8_ = psVar8->_M_string_length;
              fmt_03.size_ = 0xdd;
              fmt_03.data_ = (char *)0x1e;
              args_03.field_1.args_ = in_R9.args_;
              args_03.desc_ = (unsigned_long_long)&qres;
              ::fmt::v11::vformat_abi_cxx11_
                        (&local_d8,(v11 *)"receive PUBLICATION {} from {}",fmt_03,args_03);
              logMessageSource_05._M_str = _Var4._M_p;
              logMessageSource_05._M_len = sVar5;
              message_05._M_str = local_d8._M_dataplus._M_p;
              message_05._M_len = local_d8._M_string_length;
              logMessage(this,0x12,logMessageSource_05,message_05,false);
              std::__cxx11::string::~string((string *)&local_d8);
              std::__cxx11::string::~string((string *)&local_78);
            }
          }
          goto LAB_002aa842;
        }
        pGVar11 = pGVar11 + 1;
      } while( true );
    }
    pEVar7 = InterfaceInfo::getEndpoint
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pEVar7 == (EndpointInfo *)0x0) {
      return;
    }
    TimeCoordinator::updateMessageTime
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,
               (Time)(cmd->actionTime).internalTimeCode,(bool)(this->timeGranted_mode ^ 1));
    sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    pAVar9 = command_00;
    if (0x11 < this->maxLogLevel) {
      prettyPrintString_abi_cxx11_(&local_d8,(helics *)cmd,command_00);
      local_78._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      local_78._M_string_length = local_d8._M_string_length;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x12;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_78;
      ::fmt::v11::vformat_abi_cxx11_(&qres,(v11 *)"receive_message {}",fmt_01,args_01);
      logMessageSource_02._M_str = _Var4._M_p;
      logMessageSource_02._M_len = sVar5;
      message_02._M_str = qres._M_dataplus._M_p;
      message_02._M_len = qres._M_string_length;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)qres._M_dataplus;
      logMessage(this,0x12,logMessageSource_02,message_02,false);
      std::__cxx11::string::~string((string *)&qres);
      std::__cxx11::string::~string((string *)&local_d8);
      pAVar9 = extraout_RDX_00;
    }
    sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
       (this->timeMethod != ASYNC)) {
      prettyPrintString_abi_cxx11_(&local_78,(helics *)cmd,pAVar9);
      lVar2 = (cmd->actionTime).internalTimeCode;
      qres.field_2._M_allocated_capacity =
           (size_type)((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
      qres._M_dataplus._M_p = local_78._M_dataplus._M_p;
      qres._M_string_length = local_78._M_string_length;
      fmt_02.size_ = 0xaad;
      fmt_02.data_ = (char *)0x3d;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)&qres;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_d8,(v11 *)"received message {} at time({}) earlier than granted time({})",
                 fmt_02,args_02);
      logMessageSource_03._M_str = _Var4._M_p;
      logMessageSource_03._M_len = sVar5;
      message_03._M_str = local_d8._M_dataplus._M_p;
      message_03._M_len = local_d8._M_string_length;
      logMessage(this,3,logMessageSource_03,message_03,false);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::make_unique<helics::Message>();
    SmallBuffer::operator=((SmallBuffer *)(qres._M_dataplus._M_p + 0x10),&cmd->payload);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (qres._M_dataplus._M_p + 0x70),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar7->key);
    *(uint16_t *)(qres._M_dataplus._M_p + 8) = cmd->flags;
    *(baseType *)qres._M_dataplus._M_p = (cmd->actionTime).internalTimeCode;
    *(uint *)(qres._M_dataplus._M_p + 0xf0) = (uint)cmd->counter;
    *(int32_t *)(qres._M_dataplus._M_p + 0xc) = cmd->messageID;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (qres._M_dataplus._M_p + 0xd0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pEVar7->key);
    local_50._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
    .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         qres._M_dataplus._M_p;
    qres._M_dataplus._M_p = (pointer)0x0;
    EndpointInfo::addMessage(pEVar7,&local_50);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(&local_50);
    if ((this->state)._M_i < TERMINATING) {
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
    }
    psVar8 = &qres;
  }
  else {
    if (cmd->messageAction != cmd_send_message) {
      return;
    }
    pEVar7 = InterfaceInfo::getEndpoint
                       (&this->interfaceInformation,(InterfaceHandle)(cmd->dest_handle).hid);
    if (pEVar7 == (EndpointInfo *)0x0) {
      return;
    }
    if (pEVar7->sourceOnly != false) {
      return;
    }
    TVar10.internalTimeCode = (cmd->actionTime).internalTimeCode;
    lVar2 = (this->minimumReceiveTime).internalTimeCode;
    if (TVar10.internalTimeCode < lVar2) {
      (cmd->actionTime).internalTimeCode = lVar2;
      TVar10.internalTimeCode = lVar2;
    }
    TimeCoordinator::updateMessageTime
              ((this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl,TVar10,
               (bool)(this->timeGranted_mode ^ 1));
    sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    pAVar9 = command;
    if (0x11 < this->maxLogLevel) {
      prettyPrintString_abi_cxx11_(&local_d8,(helics *)cmd,command);
      local_78._M_dataplus._M_p = local_d8._M_dataplus._M_p;
      local_78._M_string_length = local_d8._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x12;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)&local_78;
      ::fmt::v11::vformat_abi_cxx11_(&qres,(v11 *)"receive_message {}",fmt,args);
      logMessageSource._M_str = _Var4._M_p;
      logMessageSource._M_len = sVar5;
      message._M_str = qres._M_dataplus._M_p;
      message._M_len = qres._M_string_length;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)qres._M_dataplus;
      logMessage(this,0x12,logMessageSource,message,false);
      std::__cxx11::string::~string((string *)&qres);
      std::__cxx11::string::~string((string *)&local_d8);
      pAVar9 = extraout_RDX;
    }
    sVar5 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var4._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (((cmd->actionTime).internalTimeCode < (this->time_granted).internalTimeCode) &&
       (this->timeMethod != ASYNC)) {
      prettyPrintString_abi_cxx11_(&local_78,(helics *)cmd,pAVar9);
      lVar2 = (cmd->actionTime).internalTimeCode;
      qres.field_2._M_allocated_capacity =
           (size_type)((double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000));
      qres._M_dataplus._M_p = local_78._M_dataplus._M_p;
      qres._M_string_length = local_78._M_string_length;
      fmt_00.size_ = 0xaad;
      fmt_00.data_ = (char *)0x3d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&qres;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_d8,(v11 *)"received message {} at time({}) earlier than granted time({})",
                 fmt_00,args_00);
      logMessageSource_00._M_str = _Var4._M_p;
      logMessageSource_00._M_len = sVar5;
      message_00._M_str = local_d8._M_dataplus._M_p;
      message_00._M_len = local_d8._M_string_length;
      logMessage(this,3,logMessageSource_00,message_00,false);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_78);
      query._M_str = "global_time_debugging";
      query._M_len = 0x15;
      processQueryActual_abi_cxx11_(&qres,this,query);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&qres,0,
                 "TIME DEBUGGING::");
      logMessageSource_01._M_str = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      logMessageSource_01._M_len = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      message_01._M_str = qres._M_dataplus._M_p;
      message_01._M_len = qres._M_string_length;
      logMessage(this,3,logMessageSource_01,message_01,false);
      std::__cxx11::string::~string((string *)&qres);
    }
    if ((this->state)._M_i < TERMINATING) {
      pTVar3 = (this->timeCoord)._M_t.
               super___uniq_ptr_impl<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::TimeCoordinator_*,_std::default_delete<helics::TimeCoordinator>_>
               .super__Head_base<0UL,_helics::TimeCoordinator_*,_false>._M_head_impl;
      (**(code **)((long)(pTVar3->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator + 0x18))
                (pTVar3,cmd);
    }
    createMessageFromCommand(local_48,cmd);
    EndpointInfo::addMessage
              (pEVar7,(unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)local_48
              );
    psVar8 = (string *)local_48;
  }
  std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)psVar8);
  return;
}

Assistant:

void FederateState::processDataMessage(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_SEND_MESSAGE: {
            auto* epi = interfaceInformation.getEndpoint(cmd.dest_handle);
            if (epi != nullptr && !epi->sourceOnly) {
                if (cmd.actionTime < minimumReceiveTime) {
                    cmd.actionTime = minimumReceiveTime;
                }
                // if (!epi->not_interruptible)
                {
                    timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                }
                LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                if (cmd.actionTime < time_granted &&
                    timeMethod != TimeSynchronizationMethod::ASYNC) {
                    LOG_WARNING(
                        fmt::format("received message {} at time({}) earlier than granted time({})",
                                    prettyPrintString(cmd),
                                    static_cast<double>(cmd.actionTime),
                                    static_cast<double>(time_granted)));
                    auto qres = processQueryActual("global_time_debugging");
                    qres.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(qres);
                }

                if (state <= FederateStates::EXECUTING) {
                    timeCoord->processTimeMessage(cmd);
                }
                epi->addMessage(createMessageFromCommand(std::move(cmd)));
            }
        } break;
        case CMD_PUB: {
            auto* subI = interfaceInformation.getInput(InterfaceHandle(cmd.dest_handle));
            if (subI == nullptr) {
                auto* eptI = interfaceInformation.getEndpoint(cmd.dest_handle);
                if (eptI != nullptr) {
                    // if (!epi->not_interruptible)
                    {
                        timeCoord->updateMessageTime(cmd.actionTime, !timeGranted_mode);
                    }
                    LOG_DATA(fmt::format("receive_message {}", prettyPrintString(cmd)));
                    if (cmd.actionTime < time_granted &&
                        timeMethod != TimeSynchronizationMethod::ASYNC) {
                        LOG_WARNING(fmt::format(
                            "received message {} at time({}) earlier than granted time({})",
                            prettyPrintString(cmd),
                            static_cast<double>(cmd.actionTime),
                            static_cast<double>(time_granted)));
                    }
                    auto mess = std::make_unique<Message>();
                    mess->data = std::move(cmd.payload);
                    mess->dest = eptI->key;
                    mess->flags = cmd.flags;
                    mess->time = cmd.actionTime;
                    mess->counter = cmd.counter;
                    mess->messageID = cmd.messageID;
                    mess->original_dest = eptI->key;
                    eptI->addMessage(std::move(mess));
                    if (state <= FederateStates::EXECUTING) {
                        timeCoord->processTimeMessage(cmd);
                    }
                }
                break;
            }
            for (auto& src : subI->input_sources) {
                auto valueTime = cmd.actionTime;
                if (timeMethod == TimeSynchronizationMethod::ASYNC) {
                    if (valueTime < time_granted) {
                        valueTime = time_granted;
                    }
                }
                if ((cmd.source_id == src.fed_id) && (cmd.source_handle == src.handle)) {
                    if (subI->addData(src,
                                      valueTime,
                                      cmd.counter,
                                      std::make_shared<const SmallBuffer>(
                                          std::move(cmd.payload)))) {
                        if (!subI->not_interruptible) {
                            timeCoord->updateValueTime(valueTime, !timeGranted_mode);
                            LOG_TRACE(timeCoord->printTimeStatus());
                        }
                        LOG_DATA(fmt::format("receive PUBLICATION {} from {}",
                                             prettyPrintString(cmd),
                                             subI->getSourceName(src)));
                    }
                    // this can only match once
                    break;
                }
            }
            if (state <= FederateStates::EXECUTING) {
                timeCoord->processTimeMessage(cmd);
            }
        } break;
        default:
            break;
    }
}